

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O0

void interp1Q(double x,double shift,double *y,int x_length,double *xi,int xi_length,double *yi)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  double *y_00;
  void *pvVar6;
  int local_68;
  int local_64;
  int i_1;
  int i;
  double delta_x;
  int *xi_base;
  double *delta_y;
  double *xi_fraction;
  double *yi_local;
  int xi_length_local;
  double *xi_local;
  int x_length_local;
  double *y_local;
  double shift_local;
  double x_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)xi_length;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)x_length;
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  y_00 = (double *)operator_new__(uVar4);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)xi_length;
  uVar4 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar4);
  for (local_64 = 0; local_64 < xi_length; local_64 = local_64 + 1) {
    *(int *)((long)pvVar6 + (long)local_64 * 4) = (int)((xi[local_64] - x) / shift);
    *(double *)((long)pvVar5 + (long)local_64 * 8) =
         (xi[local_64] - x) / shift - (double)*(int *)((long)pvVar6 + (long)local_64 * 4);
  }
  diff(y,x_length,y_00);
  y_00[x_length + -1] = 0.0;
  for (local_68 = 0; local_68 < xi_length; local_68 = local_68 + 1) {
    yi[local_68] = y_00[*(int *)((long)pvVar6 + (long)local_68 * 4)] *
                   *(double *)((long)pvVar5 + (long)local_68 * 8) +
                   y[*(int *)((long)pvVar6 + (long)local_68 * 4)];
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  if (y_00 != (double *)0x0) {
    operator_delete__(y_00);
  }
  return;
}

Assistant:

void interp1Q(double x, double shift, const double *y, int x_length,
    const double *xi, int xi_length, double *yi) {
  double *xi_fraction = new double[xi_length];
  double *delta_y = new double[x_length];
  int *xi_base = new int[xi_length];

  double delta_x = shift;
  for (int i = 0; i < xi_length; ++i) {
    xi_base[i] = static_cast<int>((xi[i] - x) / delta_x);
    xi_fraction[i] = (xi[i] - x) / delta_x - xi_base[i];
  }
  diff(y, x_length, delta_y);
  delta_y[x_length - 1] = 0.0;

  for (int i = 0; i < xi_length; ++i)
    yi[i] = y[xi_base[i]] + delta_y[xi_base[i]] * xi_fraction[i];

  // Bug was fixed at 2013/07/14 by M. Morise
  delete[] xi_fraction;
  delete[] xi_base;
  delete[] delta_y;
}